

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O1

size_t __thiscall henson::Scheduler::find_available_procs(Scheduler *this,size_t num_procs)

{
  ulong uVar1;
  ulong uVar2;
  _Bit_type *p_Var3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  bool bVar8;
  
  p_Var3 = (this->available_procs_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar2 = (ulong)(this->available_procs_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
          ((long)(this->available_procs_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var3) *
          8;
  if (1 < uVar2) {
    sVar6 = 0;
    uVar4 = 2;
    do {
      uVar1 = uVar4 - 1;
      uVar7 = uVar4 + 0x3e;
      if (-1 < (long)uVar1) {
        uVar7 = uVar1;
      }
      sVar5 = sVar6 + 1;
      sVar6 = 0;
      if ((p_Var3[((long)uVar7 >> 6) +
                  (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff]
           >> (uVar1 & 0x3f) & 1) != 0) {
        sVar6 = sVar5;
      }
      if (sVar6 == num_procs) {
        return uVar4 - sVar6;
      }
      bVar8 = uVar4 < uVar2;
      uVar4 = uVar4 + 1;
    } while (bVar8);
  }
  return uVar2;
}

Assistant:

size_t  find_available_procs(size_t num_procs)
        {
            size_t procs = 0;
            for(size_t i = 1; i < available_procs_.size(); ++i)
            {
                if (available_procs_[i])
                    procs++;
                else
                    procs = 0;

                if (procs == num_procs)
                    return i - (procs - 1);
            }

            return available_procs_.size();
        }